

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void __thiscall cppcms::http::context::async_flush_output(context *this,handler *h)

{
  io_mode_type iVar1;
  response *prVar2;
  cppcms_error *this_00;
  ehandler *in_stack_00000088;
  bool in_stack_00000097;
  response *in_stack_00000098;
  connection *in_stack_000000a0;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [48];
  
  prVar2 = response((context *)0x3a371d);
  iVar1 = http::response::io_mode(prVar2);
  if (iVar1 != asynchronous) {
    prVar2 = response((context *)0x3a3738);
    iVar1 = http::response::io_mode(prVar2);
    if (iVar1 != asynchronous_raw) {
      this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_30,"Can\'t use asynchronouse operations when I/O mode is synchronous",
                 &local_31);
      cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffff98);
      __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
  }
  std::__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3a380c);
  response((context *)0x3a381a);
  cppcms::impl::cgi::connection::async_write_response
            (in_stack_000000a0,in_stack_00000098,in_stack_00000097,in_stack_00000088);
  return;
}

Assistant:

void context::async_flush_output(context::handler const &h)
{
	if(response().io_mode() != http::response::asynchronous && response().io_mode()!=http::response::asynchronous_raw) {
		throw cppcms_error("Can't use asynchronouse operations when I/O mode is synchronous");
	}
	conn_->async_write_response(
		response(),
		false,
		h);
}